

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

void process_extra(char *p,size_t extra_length,zip_entry *zip_entry)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  int iVar10;
  
  uVar6 = 0;
  do {
    uVar4 = (ulong)uVar6;
    if (extra_length - 4 <= uVar4) {
      return;
    }
    uVar9 = *(ushort *)(p + uVar4 + 2);
    uVar8 = (uint)uVar9;
    uVar7 = uVar6 + 4;
    uVar5 = (ulong)(uVar6 + uVar9 + 4);
    if (uVar5 <= extra_length) {
      uVar2 = *(ushort *)(p + uVar4);
      uVar3 = uVar8;
      if (uVar2 < 0x6c65) {
        if (uVar2 == 1) {
          zip_entry->flags = zip_entry->flags | 1;
          if (zip_entry->uncompressed_size == 0xffffffff) {
            if (uVar9 < 8) goto LAB_004fc909;
            zip_entry->uncompressed_size = *(int64_t *)(p + uVar7);
            uVar7 = uVar6 + 0xc;
            uVar8 = uVar8 - 8;
          }
          if (zip_entry->compressed_size == 0xffffffff) {
            uVar3 = uVar8;
            if ((ushort)uVar8 < 8) goto LAB_004fc909;
            zip_entry->compressed_size = *(int64_t *)(p + uVar7);
            uVar7 = uVar7 + 8;
            uVar8 = uVar8 - 8;
          }
          uVar3 = uVar8;
          if ((7 < (ushort)uVar8) && (zip_entry->local_header_offset == 0xffffffff)) {
            zip_entry->local_header_offset = *(int64_t *)(p + uVar7);
            uVar7 = uVar7 + 8;
            uVar3 = uVar8 - 8;
          }
        }
        else if (uVar2 == 0x5455) {
          bVar1 = p[uVar7];
          uVar7 = uVar6 + 5;
          uVar3 = uVar8 - 1;
          if ((bVar1 & 1) != 0) {
            if ((ushort)uVar3 < 4) goto LAB_004fc909;
            zip_entry->mtime = (ulong)*(uint *)(p + uVar7);
            uVar7 = uVar6 + 9;
            uVar3 = uVar8 - 5;
          }
          if ((bVar1 & 2) != 0) {
            if ((ushort)uVar3 < 4) goto LAB_004fc909;
            zip_entry->atime = (ulong)*(uint *)(p + uVar7);
            uVar7 = uVar7 + 4;
            uVar3 = uVar3 - 4;
          }
          if (((bVar1 & 4) != 0) && (3 < (ushort)uVar3)) {
            zip_entry->ctime = (ulong)*(uint *)(p + uVar7);
            uVar7 = uVar7 + 4;
            uVar3 = uVar3 - 4;
          }
        }
        else if (uVar2 == 0x5855) {
          if (7 < uVar9) {
            zip_entry->atime = (ulong)*(uint *)(p + uVar7);
            zip_entry->mtime = (ulong)*(uint *)(p + (ulong)uVar7 + 4);
          }
          if (0xb < uVar9) {
            zip_entry->uid = (ulong)*(ushort *)(p + (ulong)uVar7 + 8);
            uVar4 = (ulong)*(ushort *)(p + (ulong)uVar7 + 10);
            goto LAB_004fc7ea;
          }
        }
      }
      else if (uVar2 == 0x6c65) {
        if (uVar9 != 0) {
          bVar1 = p[uVar7];
          uVar7 = uVar6 + 5;
          uVar3 = uVar8 - 1;
          if (((char)bVar1 < '\0') && ((short)uVar3 != 0)) {
            do {
              uVar8 = uVar3;
              uVar4 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              uVar3 = uVar8 - 1;
              if (-1 < p[uVar4]) break;
            } while ((short)uVar8 != 1);
          }
          if ((bVar1 & 1) != 0) {
            if ((ushort)uVar8 < 3) goto LAB_004fc909;
            zip_entry->system = p[(ulong)uVar7 + 1];
            uVar7 = uVar7 + 2;
            uVar3 = uVar8 - 3;
          }
          uVar6 = uVar7;
          uVar8 = uVar3;
          if ((bVar1 & 2) != 0) {
            uVar6 = uVar7 + 2;
            uVar8 = uVar3 - 2;
            if ((ushort)uVar3 < 2) goto LAB_004fc909;
          }
          uVar3 = uVar8;
          uVar7 = uVar6;
          if ((bVar1 & 4) != 0) {
            uVar9 = (ushort)uVar3;
            if (3 < uVar9) {
              if (zip_entry->system == '\x03') {
                zip_entry->mode = *(uint16_t *)(p + (ulong)uVar7 + 2);
              }
              uVar7 = uVar7 + 4;
              uVar3 = uVar3 - 4;
            }
            if (uVar9 < 4) goto LAB_004fc909;
          }
          if (((bVar1 & 8) != 0) && (1 < (ushort)uVar3)) {
            uVar9 = *(ushort *)(p + uVar7);
            uVar7 = uVar7 + 2;
            uVar3 = uVar3 - 2;
            if (uVar9 <= (ushort)uVar3) {
              uVar7 = uVar7 + uVar9;
              uVar3 = uVar3 - uVar9;
            }
          }
        }
      }
      else if (uVar2 == 0x7855) {
        if (1 < uVar9) {
          zip_entry->uid = (ulong)*(ushort *)(p + uVar7);
        }
        if (3 < uVar9) {
          uVar4 = (ulong)*(ushort *)(p + (ulong)uVar7 + 2);
          goto LAB_004fc7ea;
        }
      }
      else if (((uVar2 == 0x7875) && (uVar9 != 0)) && (uVar4 = (ulong)uVar7, p[uVar4] == '\x01')) {
        iVar10 = 0;
        if (3 < uVar9) {
          iVar10 = (int)p[uVar6 + 5];
          if (iVar10 == 2) {
            zip_entry->uid = (ulong)*(ushort *)(p + uVar4 + 2);
            iVar10 = 2;
          }
          else if ((5 < uVar9) && (p[uVar6 + 5] == '\x04')) {
            zip_entry->uid = (ulong)*(uint *)(p + uVar4 + 2);
            iVar10 = 4;
          }
        }
        if (iVar10 + 5 <= (int)uVar8) {
          if (p[uVar6 + iVar10 + 6] == '\x04') {
            if (iVar10 + 7 <= (int)uVar8) {
              uVar4 = (ulong)*(uint *)(p + (long)iVar10 + uVar4 + 3);
              goto LAB_004fc7ea;
            }
          }
          else if (p[uVar6 + iVar10 + 6] == '\x02') {
            uVar4 = (ulong)*(ushort *)(p + (long)iVar10 + uVar4 + 3);
LAB_004fc7ea:
            zip_entry->gid = uVar4;
          }
        }
      }
LAB_004fc909:
      uVar7 = uVar7 + (uVar3 & 0xffff);
    }
    uVar6 = uVar7;
    if (extra_length < uVar5) {
      return;
    }
  } while( true );
}

Assistant:

static void
process_extra(const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;

	while (offset < extra_length - 4)
	{
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);
		offset += 4;
		if (offset + datasize > extra_length)
			break;
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->uncompressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->compressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->local_header_offset =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c65:
		{
			/* Experimental 'el' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes in local file
			 * header.  This provides file type and permission
			 * information necessary to support full streaming
			 * extraction.  Currently being discussed with
			 * other Zip developers... subject to change.
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				// 2 byte "version made by"
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				// 2 byte "internal file attributes"
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				// Not used by libarchive at present.
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				// 4 byte "external file attributes"
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				// 2 byte comment length + comment
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				// Comment is not supported by libarchive
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		default:
			break;
		}
		offset += datasize;
	}
#ifdef DEBUG
	if (offset != extra_length)
	{
		fprintf(stderr,
		    "Extra data field contents do not match reported size!\n");
	}
#endif
}